

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeRTASParallelOperationDestroyExp
          (ze_rtas_parallel_operation_exp_handle_t hParallelOperation)

{
  ze_pfnRTASParallelOperationDestroyExp_t pfnDestroyExp;
  ze_result_t result;
  ze_rtas_parallel_operation_exp_handle_t hParallelOperation_local;
  
  pfnDestroyExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c1b8 != (code *)0x0) {
    pfnDestroyExp._4_4_ = (*DAT_0011c1b8)(hParallelOperation);
  }
  return pfnDestroyExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationDestroyExp(
        ze_rtas_parallel_operation_exp_handle_t hParallelOperation  ///< [in][release] handle of parallel operation object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zeDdiTable.RTASParallelOperationExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( hParallelOperation );
        }
        else
        {
            // generic implementation

        }

        return result;
    }